

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_Float_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_Float_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  AssertionHelper local_7c0;
  Fixed local_790;
  undefined1 local_608 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_5d8 [4];
  float f_3;
  Fixed local_5a8;
  undefined1 local_420 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_3f0 [4];
  float f_2;
  Fixed local_3c0;
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  float f_1;
  Fixed local_1d8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  float f;
  iu_GTestSyntaxTest_x_iutest_x_Float_Test *this_local;
  
  iutest_ar._36_4_ = 0x3f800000;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperFloatingPointEQ<float>
            ((AssertionResult *)local_40,"1.0f","f",1.0,(float)iutest_ar._36_4_);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1d8,(float)iutest_ar._36_4_);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0xba,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&f_1,pFVar2);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&f_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1.m_result = false;
    iutest_ar_1._33_3_ = 0x3f8000;
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<float>
              ((AssertionResult *)local_238,"1.0f","f",1.0,(float)iutest_ar_1._32_4_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      memset(&local_3c0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3c0,(float)iutest_ar_1._32_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_238);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_3f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xbc,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_3f0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_3f0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    iutest_ar_2._36_4_ = 0x3f800000;
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<float>
              ((AssertionResult *)local_420,"1.0f","f",1.0,(float)iutest_ar_2._36_4_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar1) {
      memset(&local_5a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5a8,(float)iutest_ar_2._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_420);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_5d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xbe,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_5d8,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_5d8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_420);
    iutest_ar_3._36_4_ = 0x3f800000;
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<float>
              ((AssertionResult *)local_608,"1.0f","f",1.0,(float)iutest_ar_3._36_4_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
    if (!bVar1) {
      memset(&local_790,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_790);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_790,(float)iutest_ar_3._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_608);
      iutest::AssertionHelper::AssertionHelper
                (&local_7c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xc0,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7c0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7c0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_790);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  }
  return;
}

Assistant:

TEST(GTestSyntaxTest, Float)
{
    if( float f = 1.0f )
        ASSERT_FLOAT_EQ(1.0f, f) << f;
    if( float f = 1.0f )
        EXPECT_FLOAT_EQ(1.0f, f) << f;
    if( float f = 1.0f )
        INFORM_FLOAT_EQ(1.0f, f) << f;
    if( float f = 1.0f )
        ASSUME_FLOAT_EQ(1.0f, f) << f;
}